

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O3

int __thiscall
icu_63::RuleBasedBreakIterator::clone
          (RuleBasedBreakIterator *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  RuleBasedBreakIterator *this_00;
  
  this_00 = (RuleBasedBreakIterator *)UMemory::operator_new((UMemory *)0x280,(size_t)__fn);
  if (this_00 != (RuleBasedBreakIterator *)0x0) {
    RuleBasedBreakIterator(this_00,this);
  }
  return (int)this_00;
}

Assistant:

BreakIterator*
RuleBasedBreakIterator::clone(void) const {
    return new RuleBasedBreakIterator(*this);
}